

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O1

void batch_decode(llama_context *ctx,llama_batch *batch,float *output,int n_seq,int n_embd)

{
  int iVar1;
  common_log *pcVar2;
  float *inp;
  ulong uVar3;
  
  llama_kv_self_clear();
  if (-1 < common_log_verbosity_thold) {
    pcVar2 = common_log_main();
    common_log_add(pcVar2,GGML_LOG_LEVEL_INFO,"%s: n_tokens = %d, n_seq = %d\n","batch_decode",
                   (ulong)(uint)batch->n_tokens,(ulong)(uint)n_seq);
  }
  iVar1 = llama_decode(ctx);
  if ((iVar1 < 0) && (-1 < common_log_verbosity_thold)) {
    pcVar2 = common_log_main();
    common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,"%s : failed to decode\n","batch_decode");
  }
  if (0 < batch->n_tokens) {
    uVar3 = 0;
    do {
      if (batch->logits[uVar3] != '\0') {
        inp = (float *)llama_get_embeddings_seq(ctx,*batch->seq_id[uVar3]);
        if ((inp == (float *)0x0) &&
           (inp = (float *)llama_get_embeddings_ith(ctx,uVar3 & 0xffffffff), inp == (float *)0x0)) {
          if (-1 < common_log_verbosity_thold) {
            pcVar2 = common_log_main();
            common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,"%s: failed to get embeddings for token %d\n"
                           ,"batch_decode",uVar3 & 0xffffffff);
          }
        }
        else {
          common_embd_normalize(inp,output + (long)*batch->seq_id[uVar3] * (long)n_embd,n_embd,2);
        }
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)batch->n_tokens);
  }
  return;
}

Assistant:

static void batch_decode(llama_context * ctx, llama_batch & batch, float * output, int n_seq, int n_embd) {
    // clear previous kv_cache values (irrelevant for embeddings)
    llama_kv_self_clear(ctx);

    // run model
    LOG_INF("%s: n_tokens = %d, n_seq = %d\n", __func__, batch.n_tokens, n_seq);
    if (llama_decode(ctx, batch) < 0) {
        LOG_ERR("%s : failed to decode\n", __func__);
    }

    for (int i = 0; i < batch.n_tokens; i++) {
        if (!batch.logits[i]) {
            continue;
        }

        // try to get sequence embeddings - supported only when pooling_type is not NONE
        const float * embd = llama_get_embeddings_seq(ctx, batch.seq_id[i][0]);
        if (embd == NULL) {
            embd = llama_get_embeddings_ith(ctx, i);
            if (embd == NULL) {
                LOG_ERR("%s: failed to get embeddings for token %d\n", __func__, i);
                continue;
            }
        }

        float * out = output + batch.seq_id[i][0] * n_embd;
        common_embd_normalize(embd, out, n_embd, 2);
    }
}